

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O2

void abuf_hexdump(autobuf *out,char *prefix,void *buffer,size_t length)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  sVar1 = length;
  while( true ) {
    uVar4 = 0x20;
    if (sVar1 < 0x20) {
      uVar4 = sVar1;
    }
    uVar5 = length - uVar2;
    if (length < uVar2 || uVar5 == 0) break;
    abuf_appendf(out,"%s%04zx:",prefix);
    if (0x1f < uVar5) {
      uVar5 = 0x20;
    }
    for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
      if ((uVar3 & 3) == 0) {
        abuf_puts(out," ");
      }
      if (uVar3 < uVar5) {
        abuf_appendf(out,"%02x",(ulong)*(byte *)((long)buffer + uVar3));
      }
      else {
        abuf_puts(out,"  ");
      }
    }
    abuf_puts(out," ");
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if ((byte)(*(char *)((long)buffer + uVar5) - 0x20U) < 0x5f) {
        abuf_appendf(out,"%c");
      }
      else {
        abuf_puts(out,".");
      }
    }
    abuf_puts(out,"\n");
    uVar2 = uVar2 + 0x20;
    buffer = (void *)((long)buffer + 0x20);
    sVar1 = sVar1 - 0x20;
  }
  return;
}

Assistant:

void
abuf_hexdump(struct autobuf *out, const char *prefix, const void *buffer, size_t length) {
  const uint8_t *buf;
  size_t j, l;

  buf = buffer;

  for (j = 0; j < length; j += 32) {
    abuf_appendf(out, "%s%04zx:", prefix, j);

    l = length - j;
    if (l > 32) {
      l = 32;
    }
    _print_hexline(out, &buf[j], l);
    abuf_puts(out, "\n");
  }
}